

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner_tests.cpp
# Opt level: O2

MatrixXd *
createDownmixMatrixFromIndices
          (MatrixXd *__return_storage_ptr__,vector<int,_std::allocator<int>_> *indices,size_t size)

{
  int iVar1;
  int *piVar2;
  Scalar *pSVar3;
  int *piVar4;
  VectorXd downmixRow;
  void *local_78 [2];
  IdentityReturnType local_68 [2];
  
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(local_68,size,size);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_68);
  piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar4 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
    iVar1 = *piVar4;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((ConstantReturnType *)local_68,size);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_78,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_68);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_78,
                        (long)iVar1);
    *pSVar3 = 1.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
               (__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows +
               1,NoChange);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows +
               -1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_78);
    free(local_78[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd createDownmixMatrixFromIndices(std::vector<int> indices,
                                               size_t size) {
  Eigen::MatrixXd downmix = Eigen::MatrixXd::Identity(size, size);
  for (int index : indices) {
    Eigen::VectorXd downmixRow = Eigen::VectorXd::Zero(size);
    downmixRow(index) = 1.0;
    downmix.conservativeResize(downmix.rows() + 1, Eigen::NoChange);
    downmix.row(downmix.rows() - 1) = downmixRow;
  }
  return downmix;
}